

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exa_constructor.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  GradeBook local_f8;
  GradeBook local_d8;
  allocator local_b1;
  string local_b0 [32];
  undefined1 local_90 [8];
  GradeBook gradeBook2;
  allocator local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  GradeBook gradeBook1;
  char **argv_local;
  int argc_local;
  
  gradeBook1._24_8_ = argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"CS101 Introduction to C++ Programming",&local_59);
  GradeBook::GradeBook((GradeBook *)local_38,(string *)local_58);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"CS102 Data Structures in C++",&local_b1);
  GradeBook::GradeBook((GradeBook *)local_90,(string *)local_b0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  poVar1 = std::operator<<((ostream *)&std::cout,"gradeBook1 created for course: ");
  GradeBook::getCourseName_abi_cxx11_(&local_d8);
  std::operator<<(poVar1,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  poVar1 = std::operator<<((ostream *)&std::cout,"\ngradeBook2 created for course: ");
  GradeBook::getCourseName_abi_cxx11_(&local_f8);
  poVar1 = std::operator<<(poVar1,(string *)&local_f8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_f8);
  GradeBook::~GradeBook((GradeBook *)local_90);
  GradeBook::~GradeBook((GradeBook *)local_38);
  return 0;
}

Assistant:

int main(int argc, const char *argv[]) {
    GradeBook gradeBook1("CS101 Introduction to C++ Programming");
    GradeBook gradeBook2("CS102 Data Structures in C++");

    // display initial value of courseName for each GradeBook
    std::cout << "gradeBook1 created for course: "
              << gradeBook1.getCourseName();
    std::cout << "\ngradeBook2 created for course: "
              << gradeBook2.getCourseName() << std::endl;

    return 0;
}